

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_striped_sse41_128_64.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_stats_table_striped_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ulong uVar1;
  long *plVar2;
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  void *pvVar6;
  void *pvVar7;
  undefined8 uVar8;
  ulong uVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 ptr;
  bool bVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  parasail_result_t *ppVar17;
  __m128i *palVar18;
  __m128i *palVar19;
  __m128i *b;
  __m128i *ptr_00;
  __m128i *palVar20;
  __m128i *ptr_01;
  __m128i *palVar21;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  int64_t *ptr_04;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  size_t len;
  ulong uVar25;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  ulong uVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  uint uVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  int iVar35;
  int iVar36;
  long lVar37;
  long lVar38;
  bool bVar39;
  long lVar40;
  ulong uVar41;
  uint uVar42;
  longlong *plVar43;
  longlong *plVar44;
  ulong uVar45;
  long lVar46;
  long lVar47;
  size_t len_00;
  ulong size;
  __m128i *ptr_05;
  int iVar48;
  __m128i *ptr_06;
  ulong uVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  int64_t iVar70;
  longlong lVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  long lVar79;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  longlong lVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  __m128i_64_t B_8;
  undefined1 auVar88 [16];
  __m128i_64_t B_1;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  __m128i_64_t B_9;
  longlong lVar95;
  undefined1 auVar94 [16];
  __m128i_64_t B_3;
  longlong lVar97;
  undefined1 auVar96 [16];
  __m128i_64_t B_4;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  __m128i_64_t B_2;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  __m128i_64_t A;
  undefined1 auVar104 [16];
  long lVar107;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  __m128i_64_t B;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  __m128i alVar112;
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i_64_t e;
  __m128i_64_t h;
  int local_264;
  ulong local_240;
  __m128i *local_228;
  undefined1 local_1e8 [16];
  undefined1 local_148 [16];
  ulong uStack_c0;
  longlong local_a8;
  longlong lStack_a0;
  longlong local_98;
  longlong lStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_stats_table_striped_profile_sse41_128_64_cold_8();
  }
  else {
    pvVar4 = (profile->profile64).score;
    if (pvVar4 == (void *)0x0) {
      parasail_sg_flags_stats_table_striped_profile_sse41_128_64_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_stats_table_striped_profile_sse41_128_64_cold_6();
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          parasail_sg_flags_stats_table_striped_profile_sse41_128_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_stats_table_striped_profile_sse41_128_64_cold_4();
        }
        else {
          uVar41 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sg_flags_stats_table_striped_profile_sse41_128_64_cold_3();
          }
          else if (open < 0) {
            parasail_sg_flags_stats_table_striped_profile_sse41_128_64_cold_2();
          }
          else if (gap < 0) {
            parasail_sg_flags_stats_table_striped_profile_sse41_128_64_cold_1();
          }
          else {
            uVar14 = uVar3 - 1;
            uVar45 = (ulong)uVar3 + 1;
            size = uVar45 >> 1;
            uVar9 = (ulong)uVar14 % size;
            iVar36 = (int)(uVar14 / size);
            pvVar6 = (profile->profile64).matches;
            pvVar7 = (profile->profile64).similar;
            uVar24 = (ulong)(uint)open;
            iVar48 = -open;
            iVar35 = ppVar5->min;
            len_00 = 0x8000000000000000 - (long)iVar35;
            if (iVar35 != iVar48 && SBORROW4(iVar35,iVar48) == iVar35 + open < 0) {
              len_00 = uVar24 | 0x8000000000000000;
            }
            iVar35 = ppVar5->max;
            ppVar17 = parasail_result_new_table3((uint)uVar45 & 0x7ffffffe,s2Len);
            if (ppVar17 != (parasail_result_t *)0x0) {
              ppVar17->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar17->flag | 0x2830802;
              palVar18 = parasail_memalign___m128i(0x10,size);
              local_1e8._8_8_ = local_1e8._0_8_;
              local_1e8._0_8_ = palVar18;
              palVar19 = parasail_memalign___m128i(0x10,size);
              b = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign___m128i(0x10,size);
              palVar20 = parasail_memalign___m128i(0x10,size);
              ptr_01 = parasail_memalign___m128i(0x10,size);
              palVar21 = parasail_memalign___m128i(0x10,size);
              ptr_02 = parasail_memalign___m128i(0x10,size);
              ptr_03 = parasail_memalign___m128i(0x10,size);
              b_00 = parasail_memalign___m128i(0x10,size);
              b_01 = parasail_memalign___m128i(0x10,size);
              b_02 = parasail_memalign___m128i(0x10,size);
              ptr_04 = parasail_memalign_int64_t(0x10,(ulong)(s2Len + 1U));
              auVar50._0_8_ = -(ulong)(palVar18 == (__m128i *)0x0);
              auVar50._8_8_ = -(ulong)(palVar19 == (__m128i *)0x0);
              auVar72._0_8_ = -(ulong)(b == (__m128i *)0x0);
              auVar72._8_8_ = -(ulong)(ptr_00 == (__m128i *)0x0);
              auVar50 = packssdw(auVar50,auVar72);
              auVar81._0_8_ = -(ulong)(palVar20 == (__m128i *)0x0);
              auVar81._8_8_ = -(ulong)(ptr_01 == (__m128i *)0x0);
              auVar93._0_8_ = -(ulong)(palVar21 == (__m128i *)0x0);
              auVar93._8_8_ = -(ulong)(ptr_02 == (__m128i *)0x0);
              auVar81 = packssdw(auVar81,auVar93);
              auVar50 = packssdw(auVar50,auVar81);
              if (((((b_00 != (__m128i *)0x0 && ptr_03 != (__m128i *)0x0) && b_01 != (__m128i *)0x0)
                   && b_02 != (__m128i *)0x0) && ptr_04 != (int64_t *)0x0) &&
                  ((((((((((((((((auVar50 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                                (auVar50 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar50 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar50 >> 0x1f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar50 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar50 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar50 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar50 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar50 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar50 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar50 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar50 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar50 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar50 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar50 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar50[0xf])) {
                iVar15 = s2Len + -1;
                iVar16 = 1 - iVar36;
                uVar49 = (ulong)(uint)gap;
                uVar1 = len_00 + 1;
                local_88 = 0x7ffffffffffffffe - (long)iVar35;
                auVar51._8_4_ = (int)uVar1;
                auVar51._0_8_ = uVar1;
                auVar51._12_4_ = (int)(uVar1 >> 0x20);
                uStack_80 = 0;
                auVar109._8_4_ = (int)local_88;
                auVar109._0_8_ = local_88;
                auVar109._12_4_ = (int)((ulong)local_88 >> 0x20);
                auVar88._0_8_ = (long)iVar16;
                auVar88._8_4_ = iVar16;
                auVar88._12_4_ = iVar16 >> 0x1f;
                alVar112[1] = uVar1;
                alVar112[0] = size;
                len = len_00;
                parasail_memset___m128i(b,alVar112,len_00);
                c[1] = extraout_RDX;
                c[0] = size;
                parasail_memset___m128i(palVar20,c,len);
                c_00[1] = extraout_RDX_00;
                c_00[0] = size;
                parasail_memset___m128i(palVar21,c_00,len);
                c_01[1] = extraout_RDX_01;
                c_01[0] = size;
                parasail_memset___m128i(b_00,c_01,len);
                c_02[1] = extraout_RDX_02;
                c_02[0] = size;
                parasail_memset___m128i(b_01,c_02,len);
                c_03[1] = extraout_RDX_03;
                c_03[0] = size;
                parasail_memset___m128i(b_02,c_03,len);
                lVar30 = (long)iVar48;
                uVar26 = 0;
                do {
                  lVar46 = 0;
                  plVar43 = &local_a8;
                  plVar44 = &local_98;
                  bVar13 = true;
                  do {
                    bVar39 = bVar13;
                    if (s1_beg == 0) {
                      lVar46 = lVar30 - (lVar46 * size + uVar26) * (ulong)(uint)gap;
                    }
                    else {
                      lVar46 = 0;
                    }
                    *plVar44 = lVar46;
                    *plVar43 = lVar46 - uVar24;
                    lVar46 = 1;
                    plVar43 = &lStack_a0;
                    plVar44 = &lStack_90;
                    bVar13 = false;
                  } while (bVar39);
                  palVar18[uVar26][0] = local_98;
                  palVar18[uVar26][1] = lStack_90;
                  ptr_03[uVar26][0] = local_a8;
                  ptr_03[uVar26][1] = lStack_a0;
                  uVar26 = uVar26 + 1;
                } while (uVar26 != size);
                *ptr_04 = 0;
                auVar50 = _DAT_00906ca0;
                lVar46 = uVar41 - 1;
                auVar52._8_4_ = (int)lVar46;
                auVar52._0_8_ = lVar46;
                auVar52._12_4_ = (int)((ulong)lVar46 >> 0x20);
                auVar72 = pmovsxbq(auVar72,0x100);
                auVar52 = auVar52 ^ _DAT_00906ca0;
                uVar26 = 0;
                do {
                  if ((bool)(~(auVar52._0_8_ < (long)(uVar26 ^ auVar50._0_8_)) & 1)) {
                    iVar35 = 0;
                    if (s2_beg == 0) {
                      iVar35 = iVar48;
                    }
                    ptr_04[uVar26 + 1] = (long)iVar35;
                  }
                  auVar101._8_4_ = (int)uVar26;
                  auVar101._0_8_ = uVar26;
                  auVar101._12_4_ = (int)(uVar26 >> 0x20);
                  if ((long)((auVar101._8_8_ | auVar72._8_8_) ^ auVar50._8_8_) <= auVar52._8_8_) {
                    iVar35 = iVar48 - gap;
                    if (s2_beg != 0) {
                      iVar35 = 0;
                    }
                    ptr_04[uVar26 + 2] = (long)iVar35;
                  }
                  uVar26 = uVar26 + 2;
                  iVar48 = iVar48 + gap * -2;
                } while ((s2Len + 1U & 0xfffffffe) != uVar26);
                uVar10 = (uint)size;
                uVar31 = uVar10 - 1;
                lVar40 = size * uVar41 * 4;
                lVar46 = uVar41 * 4;
                lVar34 = 0;
                local_148._8_8_ = auVar88._8_8_;
                local_148._8_8_ = -(ulong)(local_148._8_8_ == 0);
                local_148._0_8_ = -(ulong)(auVar88._0_8_ == 1);
                uVar26 = 0;
                lVar22 = lVar40;
                auVar77 = auVar51;
                auVar104 = auVar51;
                auVar102 = auVar51;
                auVar99 = auVar51;
                auVar50 = auVar51;
                local_264 = iVar15;
                do {
                  local_228 = palVar19;
                  local_78 = auVar99;
                  local_68 = auVar102;
                  local_58 = auVar104;
                  local_48 = auVar77;
                  ptr_06 = ptr_01;
                  ptr_05 = ptr_00;
                  palVar18 = ptr_02;
                  ptr_00 = b;
                  ptr_01 = palVar20;
                  ptr_02 = palVar21;
                  ptr = local_1e8._0_8_;
                  palVar19 = (__m128i *)local_1e8._0_8_;
                  palVar21 = (__m128i *)(local_1e8._0_8_ + (ulong)uVar31 * 0x10);
                  lVar97 = ptr_00[uVar31][0];
                  lVar80 = ptr_01[uVar31][0];
                  lVar95 = ptr_02[uVar31][0];
                  palVar20 = (__m128i *)(local_1e8._0_8_ + (ulong)uVar31 * 0x10);
                  auVar73._8_4_ = (int)(*palVar20)[0];
                  auVar73._0_8_ = (*palVar20)[0];
                  auVar73._12_4_ = *(undefined4 *)((long)*palVar20 + 4);
                  lVar28 = 0;
                  lVar79 = 0;
                  iVar70 = ptr_04[uVar26];
                  lVar33 = auVar73._8_8_;
                  lVar38 = 0;
                  lVar37 = (long)ppVar5->mapper[(byte)s2[uVar26]] * (long)(int)uVar10 * 0x10;
                  local_1e8 = (undefined1  [16])0x0;
                  lVar32 = 0;
                  auVar72 = ZEXT816(0);
                  lVar27 = lVar22;
                  lVar47 = lVar34;
                  auVar86 = _DAT_009050f0;
                  auVar90 = auVar51;
                  do {
                    auVar81 = *(undefined1 (*) [16])((long)*ptr_03 + lVar32);
                    plVar2 = (long *)((long)pvVar4 + lVar32 + lVar37);
                    auVar74._0_8_ = iVar70 + *plVar2;
                    auVar74._8_8_ = lVar33 + plVar2[1];
                    auVar53._0_8_ = -(ulong)(auVar81._0_8_ < auVar74._0_8_);
                    auVar53._8_8_ = -(ulong)(auVar81._8_8_ < auVar74._8_8_);
                    auVar88 = blendvpd(auVar81,auVar74,auVar53);
                    auVar93 = *(undefined1 (*) [16])((long)*b_02 + lVar32);
                    auVar82._0_8_ = -(ulong)(auVar90._0_8_ < auVar88._0_8_);
                    auVar82._8_8_ = -(ulong)(auVar90._8_8_ < auVar88._8_8_);
                    auVar104 = blendvpd(auVar90,auVar88,auVar82);
                    auVar88 = *(undefined1 (*) [16])((long)*b_00 + lVar32);
                    auVar52 = *(undefined1 (*) [16])((long)*b_01 + lVar32);
                    *(undefined1 (*) [16])((long)*local_228 + lVar32) = auVar104;
                    auVar101 = blendvpd(auVar72,auVar88,auVar82);
                    plVar2 = (long *)((long)pvVar6 + lVar32 + lVar37);
                    auVar96._0_8_ = lVar28 + *plVar2;
                    auVar96._8_8_ = lVar97 + plVar2[1];
                    lVar33 = auVar104._0_8_;
                    auVar75._0_8_ = -(ulong)(auVar74._0_8_ == lVar33);
                    lVar107 = auVar104._8_8_;
                    auVar75._8_8_ = -(ulong)(auVar74._8_8_ == lVar107);
                    auVar102 = blendvpd(auVar101,auVar96,auVar75);
                    auVar101 = blendvpd(local_1e8,auVar52,auVar82);
                    *(undefined1 (*) [16])((long)*ptr_05 + lVar32) = auVar102;
                    plVar2 = (long *)((long)pvVar7 + lVar32 + lVar37);
                    auVar98._0_8_ = lVar79 + *plVar2;
                    auVar98._8_8_ = lVar80 + plVar2[1];
                    auVar101 = blendvpd(auVar101,auVar98,auVar75);
                    auVar99 = blendvpd(auVar86,auVar93,auVar82);
                    *(undefined1 (*) [16])((long)*ptr_06 + lVar32) = auVar101;
                    auVar111._8_4_ = 0xffffffff;
                    auVar111._0_8_ = 0xffffffffffffffff;
                    auVar111._12_4_ = 0xffffffff;
                    auVar94._0_8_ = lVar38 + 1;
                    lVar38 = auVar111._8_8_;
                    auVar94._8_8_ = lVar95 - lVar38;
                    auVar99 = blendvpd(auVar99,auVar94,auVar75);
                    *(undefined1 (*) [16])((long)*palVar18 + lVar32) = auVar99;
                    lVar28 = *(long *)((long)((ppVar17->field_4).trace)->trace_del_table + 8);
                    *(int *)(lVar28 + lVar47) = auVar102._0_4_;
                    uVar8 = extractps(auVar102,2);
                    *(undefined8 *)(lVar28 + lVar27) = uVar8;
                    lVar28 = *(long *)((long)((ppVar17->field_4).trace)->trace_del_table + 0x10);
                    *(int *)(lVar28 + lVar47) = auVar101._0_4_;
                    uVar8 = extractps(auVar101,2);
                    *(undefined8 *)(lVar28 + lVar27) = uVar8;
                    lVar28 = *(long *)((long)((ppVar17->field_4).trace)->trace_del_table + 0x18);
                    *(int *)(lVar28 + lVar47) = auVar99._0_4_;
                    uVar8 = extractps(auVar99,2);
                    *(undefined8 *)(lVar28 + lVar27) = uVar8;
                    lVar28 = *((ppVar17->field_4).trace)->trace_del_table;
                    *(int *)(lVar28 + lVar47) = auVar104._0_4_;
                    *(int *)(lVar28 + lVar27) = auVar104._8_4_;
                    auVar54._0_8_ = -(ulong)(auVar109._0_8_ < lVar33);
                    auVar54._8_8_ = -(ulong)(auVar109._8_8_ < lVar107);
                    auVar109 = blendvpd(auVar104,auVar109,auVar54);
                    auVar55._0_8_ = -(ulong)(lVar33 < auVar50._0_8_);
                    auVar55._8_8_ = -(ulong)(lVar107 < auVar50._8_8_);
                    auVar50 = blendvpd(auVar104,auVar50,auVar55);
                    auVar56._0_8_ = -(ulong)(auVar102._0_8_ < auVar50._0_8_);
                    auVar56._8_8_ = -(ulong)(auVar102._8_8_ < auVar50._8_8_);
                    auVar50 = blendvpd(auVar102,auVar50,auVar56);
                    auVar57._0_8_ = -(ulong)(auVar101._0_8_ < auVar50._0_8_);
                    auVar57._8_8_ = -(ulong)(auVar101._8_8_ < auVar50._8_8_);
                    auVar50 = blendvpd(auVar101,auVar50,auVar57);
                    auVar58._0_8_ = -(ulong)(auVar99._0_8_ < auVar50._0_8_);
                    auVar58._8_8_ = -(ulong)(auVar99._8_8_ < auVar50._8_8_);
                    auVar50 = blendvpd(auVar99,auVar50,auVar58);
                    auVar105._0_8_ = lVar33 - (ulong)(uint)open;
                    auVar105._8_8_ = lVar107 - (ulong)(uint)open;
                    uStack_c0 = (ulong)(uint)gap;
                    auVar108._0_8_ = auVar81._0_8_ - uVar49;
                    auVar108._8_8_ = auVar81._8_8_ - uStack_c0;
                    auVar59._0_8_ = -(ulong)(auVar108._0_8_ < auVar105._0_8_);
                    auVar59._8_8_ = -(ulong)(auVar108._8_8_ < auVar105._8_8_);
                    auVar104 = blendvpd(auVar108,auVar105,auVar59);
                    auVar88 = blendvpd(auVar88,auVar102,auVar59);
                    auVar81 = blendvpd(auVar52,auVar101,auVar59);
                    auVar92._0_8_ = auVar93._0_8_ + 1;
                    auVar92._8_8_ = auVar93._8_8_ - lVar38;
                    auVar100._0_8_ = auVar99._0_8_ + 1;
                    auVar100._8_8_ = auVar99._8_8_ - lVar38;
                    auVar93 = blendvpd(auVar92,auVar100,auVar59);
                    auVar89._0_8_ = auVar90._0_8_ - uVar49;
                    auVar89._8_8_ = auVar90._8_8_ - uStack_c0;
                    auVar60._0_8_ = -(ulong)(auVar89._0_8_ < auVar105._0_8_);
                    auVar60._8_8_ = -(ulong)(auVar89._8_8_ < auVar105._8_8_);
                    auVar90 = blendvpd(auVar89,auVar105,auVar60);
                    auVar72 = blendvpd(auVar72,auVar102,auVar60);
                    *(undefined1 (*) [16])((long)*ptr_03 + lVar32) = auVar104;
                    *(undefined1 (*) [16])((long)*b_00 + lVar32) = auVar88;
                    *(undefined1 (*) [16])((long)*b_01 + lVar32) = auVar81;
                    *(undefined1 (*) [16])((long)*b_02 + lVar32) = auVar93;
                    local_1e8 = blendvpd(local_1e8,auVar101,auVar60);
                    auVar85._0_8_ = auVar86._0_8_ + 1;
                    auVar85._8_8_ = auVar86._8_8_ - lVar38;
                    auVar86 = blendvpd(auVar85,auVar100,auVar60);
                    plVar2 = (long *)((long)(longlong *)ptr + lVar32);
                    iVar70 = *plVar2;
                    lVar33 = plVar2[1];
                    plVar2 = (long *)((long)*ptr_00 + lVar32);
                    lVar28 = *plVar2;
                    lVar97 = plVar2[1];
                    plVar2 = (long *)((long)*ptr_01 + lVar32);
                    lVar79 = *plVar2;
                    lVar80 = plVar2[1];
                    plVar2 = (long *)((long)*ptr_02 + lVar32);
                    lVar38 = *plVar2;
                    lVar95 = plVar2[1];
                    lVar32 = lVar32 + 0x10;
                    lVar27 = lVar27 + lVar46;
                    lVar47 = lVar47 + lVar46;
                  } while (size << 4 != lVar32);
                  auVar103._8_4_ = 0xffffffff;
                  auVar103._0_8_ = 0xffffffffffffffff;
                  auVar103._12_4_ = 0xffffffff;
                  auVar81 = local_1e8;
                  bVar13 = true;
                  do {
                    bVar39 = bVar13;
                    alVar112 = *palVar21;
                    lVar28 = lVar30;
                    if (s2_beg == 0) {
                      lVar28 = ptr_04[uVar26 + 1] - uVar24;
                    }
                    auVar83._0_8_ = alVar112[0];
                    auVar83._8_4_ = (int)alVar112[0];
                    auVar83._12_4_ = alVar112[0]._4_4_;
                    auVar91._0_8_ = auVar90._0_8_;
                    auVar91._8_4_ = auVar90._0_4_;
                    auVar91._12_4_ = auVar90._4_4_;
                    auVar11._8_8_ = 0;
                    auVar11._0_8_ = auVar72._0_8_;
                    auVar72 = auVar11 << 0x40;
                    auVar12._8_8_ = 0;
                    auVar12._0_8_ = auVar81._0_8_;
                    auVar81 = auVar12 << 0x40;
                    auVar87._0_8_ = auVar86._0_8_;
                    auVar87._8_4_ = auVar86._0_4_;
                    auVar87._12_4_ = auVar86._4_4_;
                    iVar70 = ptr_04[uVar26];
                    lVar38 = auVar83._8_8_;
                    auVar90._8_8_ = auVar91._8_8_;
                    auVar90._0_8_ = lVar28;
                    auVar86._8_8_ = auVar87._8_8_;
                    auVar86._0_8_ = 1;
                    lVar33 = 0;
                    lVar28 = lVar34;
                    do {
                      plVar2 = (long *)((long)pvVar4 + lVar33 + lVar37);
                      lVar79 = *plVar2;
                      lVar27 = plVar2[1];
                      auVar93 = *(undefined1 (*) [16])((long)*local_228 + lVar33);
                      auVar61._0_8_ = -(ulong)(auVar90._0_8_ < auVar93._0_8_);
                      lVar32 = auVar90._8_8_;
                      auVar61._8_8_ = -(ulong)(lVar32 < auVar93._8_8_);
                      auVar93 = blendvpd(auVar90,auVar93,auVar61);
                      *(undefined1 (*) [16])((long)*local_228 + lVar33) = auVar93;
                      lVar47 = auVar93._0_8_;
                      auVar84._0_8_ = -(ulong)(iVar70 + lVar79 == lVar47);
                      lVar79 = auVar93._8_8_;
                      auVar84._8_8_ = -(ulong)(lVar38 + lVar27 == lVar79);
                      auVar84 = auVar84 | auVar61;
                      auVar88 = blendvpd(auVar72,*(undefined1 (*) [16])((long)*ptr_05 + lVar33),
                                         auVar84);
                      *(undefined1 (*) [16])((long)*ptr_05 + lVar33) = auVar88;
                      auVar52 = blendvpd(auVar81,*(undefined1 (*) [16])((long)*ptr_06 + lVar33),
                                         auVar84);
                      *(undefined1 (*) [16])((long)*ptr_06 + lVar33) = auVar52;
                      auVar101 = blendvpd(auVar86,*(undefined1 (*) [16])((long)*palVar18 + lVar33),
                                          auVar84);
                      auVar62._0_8_ = -(ulong)(auVar109._0_8_ < lVar47);
                      auVar62._8_8_ = -(ulong)(auVar109._8_8_ < lVar79);
                      auVar109 = blendvpd(auVar93,auVar109,auVar62);
                      auVar63._0_8_ = -(ulong)(lVar47 < auVar50._0_8_);
                      auVar63._8_8_ = -(ulong)(lVar79 < auVar50._8_8_);
                      auVar50 = blendvpd(auVar93,auVar50,auVar63);
                      *(undefined1 (*) [16])((long)*palVar18 + lVar33) = auVar101;
                      auVar64._0_8_ = -(ulong)(auVar88._0_8_ < auVar50._0_8_);
                      auVar64._8_8_ = -(ulong)(auVar88._8_8_ < auVar50._8_8_);
                      auVar50 = blendvpd(auVar88,auVar50,auVar64);
                      lVar38 = *(long *)((long)((ppVar17->field_4).trace)->trace_del_table + 8);
                      *(int *)(lVar38 + lVar28) = auVar88._0_4_;
                      *(int *)(lVar40 + lVar38 + lVar28) = auVar88._8_4_;
                      auVar65._0_8_ = -(ulong)(auVar52._0_8_ < auVar50._0_8_);
                      auVar65._8_8_ = -(ulong)(auVar52._8_8_ < auVar50._8_8_);
                      lVar38 = *(long *)((long)((ppVar17->field_4).trace)->trace_del_table + 0x10);
                      *(int *)(lVar38 + lVar28) = auVar52._0_4_;
                      *(int *)(lVar40 + lVar38 + lVar28) = auVar52._8_4_;
                      auVar50 = blendvpd(auVar52,auVar50,auVar65);
                      lVar38 = *(long *)((long)((ppVar17->field_4).trace)->trace_del_table + 0x18);
                      *(int *)(lVar38 + lVar28) = auVar101._0_4_;
                      uVar8 = extractps(auVar101,2);
                      *(undefined8 *)(lVar40 + lVar38 + lVar28) = uVar8;
                      auVar66._0_8_ = -(ulong)(auVar101._0_8_ < auVar50._0_8_);
                      auVar66._8_8_ = -(ulong)(auVar101._8_8_ < auVar50._8_8_);
                      lVar38 = *((ppVar17->field_4).trace)->trace_del_table;
                      *(int *)(lVar38 + lVar28) = auVar93._0_4_;
                      lVar38 = lVar38 + lVar28;
                      *(int *)(lVar40 + lVar38) = auVar93._8_4_;
                      auVar50 = blendvpd(auVar101,auVar50,auVar66);
                      auVar90._0_8_ = auVar90._0_8_ - uVar49;
                      auVar90._8_8_ = lVar32 - uStack_c0;
                      auVar76._0_8_ = -(ulong)(auVar90._0_8_ < (long)(lVar47 - (ulong)(uint)open));
                      auVar76._8_8_ = -(ulong)(auVar90._8_8_ < (long)(lVar79 - (ulong)(uint)open));
                      iVar35 = movmskpd((int)lVar38,auVar76);
                      if (iVar35 == 3) goto LAB_006edff5;
                      auVar72 = blendvpd(auVar72,auVar88,auVar76);
                      auVar81 = blendvpd(auVar81,auVar52,auVar76);
                      auVar93 = blendvpd(auVar86,auVar101,auVar76);
                      auVar86._0_8_ = auVar93._0_8_ + 1;
                      auVar86._8_8_ = auVar93._8_8_ - auVar103._8_8_;
                      plVar2 = (long *)((long)(longlong *)ptr + lVar33);
                      iVar70 = *plVar2;
                      lVar38 = plVar2[1];
                      lVar33 = lVar33 + 0x10;
                      lVar28 = lVar28 + lVar46;
                    } while (size << 4 != lVar33);
                    bVar13 = false;
                  } while (bVar39);
LAB_006edff5:
                  alVar112 = local_228[uVar9];
                  auVar67._0_8_ = -(ulong)(local_78._0_8_ < alVar112[0]);
                  auVar67._8_8_ = -(ulong)(local_78._8_8_ < alVar112[1]);
                  auVar99 = blendvpd(local_78,(undefined1  [16])alVar112,auVar67);
                  local_240 = auVar99._8_8_;
                  auVar102 = blendvpd(local_68,(undefined1  [16])ptr_05[uVar9],auVar67);
                  uVar23 = auVar102._8_8_;
                  auVar104 = blendvpd(local_58,(undefined1  [16])ptr_06[uVar9],auVar67);
                  uVar25 = auVar104._8_8_;
                  auVar77 = blendvpd(local_48,(undefined1  [16])palVar18[uVar9],auVar67);
                  uVar29 = auVar77._8_8_;
                  iVar35 = movmskpd((int)uVar9 * 0x10,auVar67 & local_148);
                  if (iVar35 != 0) {
                    local_264 = (int)uVar26;
                  }
                  uVar26 = uVar26 + 1;
                  lVar22 = lVar22 + 4;
                  lVar34 = lVar34 + 4;
                  local_1e8._0_8_ = local_228;
                  palVar21 = palVar18;
                  palVar20 = ptr_06;
                  b = ptr_05;
                  if (uVar26 == uVar41) {
                    if (s2_end == 0) {
                      uVar23 = 0;
                      uVar25 = 0;
                      uVar29 = 0;
                      local_240 = uVar1;
                    }
                    else if (iVar36 < 1) {
                      do {
                        local_240 = auVar99._0_8_;
                        auVar99._8_8_ = 0;
                        auVar99._0_8_ = local_240;
                        auVar99 = auVar99 << 0x40;
                        uVar23 = auVar102._0_8_;
                        auVar102._8_8_ = 0;
                        auVar102._0_8_ = uVar23;
                        auVar102 = auVar102 << 0x40;
                        uVar25 = auVar104._0_8_;
                        auVar104._8_8_ = 0;
                        auVar104._0_8_ = uVar25;
                        auVar104 = auVar104 << 0x40;
                        uVar29 = auVar77._0_8_;
                        auVar77._8_8_ = 0;
                        auVar77._0_8_ = uVar29;
                        auVar77 = auVar77 << 0x40;
                      } while (iVar36 < 0);
                    }
                    iVar48 = (int)uVar29;
                    iVar16 = (int)uVar25;
                    iVar35 = (int)uVar23;
                    uVar31 = uVar14;
                    if ((s1_end != 0) && ((uVar45 & 0x7ffffffe) != 0)) {
                      uVar41 = 0;
                      do {
                        uVar42 = 0;
                        if ((uVar41 & 1) != 0) {
                          uVar42 = uVar10;
                        }
                        uVar42 = uVar42 + ((uint)(uVar41 >> 1) & 0x7fffffff);
                        if ((int)uVar42 < (int)uVar3) {
                          uVar45 = (*local_228)[uVar41];
                          if (((long)local_240 < (long)uVar45) ||
                             (((uVar45 == local_240 && (local_264 == iVar15)) &&
                              (uVar45 = local_240, (int)uVar42 < (int)uVar31)))) {
                            uVar23 = (*ptr_05)[uVar41];
                            uVar25 = (*ptr_06)[uVar41];
                            uVar29 = (*palVar18)[uVar41];
                            uVar31 = uVar42;
                            local_264 = iVar15;
                            local_240 = uVar45;
                          }
                        }
                        iVar48 = (int)uVar29;
                        iVar16 = (int)uVar25;
                        iVar35 = (int)uVar23;
                        uVar41 = uVar41 + 1;
                      } while ((uVar10 & 0x3fffffff) * 2 != (int)uVar41);
                    }
                    if (s2_end == 0 && s1_end == 0) {
                      lVar97 = local_228[uVar9][0];
                      local_240._0_4_ = (int)local_228[uVar9][1];
                      lVar80 = ptr_05[uVar9][0];
                      iVar35 = (int)ptr_05[uVar9][1];
                      lVar71 = ptr_06[uVar9][0];
                      iVar16 = (int)ptr_06[uVar9][1];
                      lVar95 = palVar18[uVar9][0];
                      iVar48 = (int)palVar18[uVar9][1];
                      uVar31 = uVar14;
                      local_264 = iVar15;
                      if (iVar36 < 1) {
                        do {
                          local_240._0_4_ = (int)lVar97;
                          iVar48 = (int)lVar95;
                          iVar16 = (int)lVar71;
                          iVar35 = (int)lVar80;
                          lVar97 = 0;
                          lVar80 = 0;
                          lVar71 = 0;
                          lVar95 = 0;
                        } while (iVar36 < 0);
                      }
                    }
                    auVar68._8_4_ = (int)len_00;
                    auVar68._0_8_ = len_00;
                    auVar68._12_4_ = (int)(len_00 >> 0x20);
                    auVar110._0_8_ = -(ulong)((long)len_00 < auVar109._0_8_);
                    auVar110._8_8_ = -(ulong)(auVar68._8_8_ < auVar109._8_8_);
                    auVar69._8_4_ = 0xffffffff;
                    auVar69._0_8_ = 0xffffffffffffffff;
                    auVar69._12_4_ = 0xffffffff;
                    auVar78._8_4_ = (undefined4)local_88;
                    auVar78._0_8_ = local_88;
                    auVar78._12_4_ = local_88._4_4_;
                    auVar106._0_8_ = -(ulong)(local_88 < auVar50._0_8_);
                    auVar106._8_8_ = -(ulong)(auVar78._8_8_ < auVar50._8_8_);
                    iVar36 = movmskpd(s1_end,auVar106 | auVar69 ^ auVar110);
                    if (iVar36 != 0) {
                      *(byte *)&ppVar17->flag = (byte)ppVar17->flag | 0x40;
                      local_240._0_4_ = 0;
                      iVar35 = 0;
                      iVar16 = 0;
                      iVar48 = 0;
                      local_264 = 0;
                      uVar31 = 0;
                    }
                    ppVar17->score = (int)local_240;
                    ppVar17->end_query = uVar31;
                    ppVar17->end_ref = local_264;
                    ((ppVar17->field_4).stats)->matches = iVar35;
                    ((ppVar17->field_4).stats)->similar = iVar16;
                    ((ppVar17->field_4).stats)->length = iVar48;
                    parasail_free(ptr_04);
                    parasail_free(b_02);
                    parasail_free(b_01);
                    parasail_free(b_00);
                    parasail_free(ptr_03);
                    parasail_free(ptr_02);
                    parasail_free(palVar18);
                    parasail_free(ptr_01);
                    parasail_free(ptr_06);
                    parasail_free(ptr_00);
                    parasail_free(ptr_05);
                    parasail_free((void *)ptr);
                    parasail_free(local_228);
                    return ppVar17;
                  }
                } while( true );
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMStore = NULL;
    __m128i* restrict pvHMLoad = NULL;
    __m128i* restrict pvHSStore = NULL;
    __m128i* restrict pvHSLoad = NULL;
    __m128i* restrict pvHLStore = NULL;
    __m128i* restrict pvHLLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    int64_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxHM;
    __m128i vMaxHS;
    __m128i vMaxHL;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m128i*)profile->profile64.score;
    vProfileM = (__m128i*)profile->profile64.matches;
    vProfileS = (__m128i*)profile->profile64.similar;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi64x_rpl(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHM = vNegLimit;
    vMaxHS = vNegLimit;
    vMaxHL = vNegLimit;
    vPosMask = _mm_cmpeq_epi64(_mm_set1_epi64x_rpl(position),
            _mm_set_epi64x_rpl(0,1));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m128i(16, segLen);
    pvHLoad   = parasail_memalign___m128i(16, segLen);
    pvHMStore = parasail_memalign___m128i(16, segLen);
    pvHMLoad  = parasail_memalign___m128i(16, segLen);
    pvHSStore = parasail_memalign___m128i(16, segLen);
    pvHSLoad  = parasail_memalign___m128i(16, segLen);
    pvHLStore = parasail_memalign___m128i(16, segLen);
    pvHLLoad  = parasail_memalign___m128i(16, segLen);
    pvE       = parasail_memalign___m128i(16, segLen);
    pvEM      = parasail_memalign___m128i(16, segLen);
    pvES      = parasail_memalign___m128i(16, segLen);
    pvEL      = parasail_memalign___m128i(16, segLen);
    boundary  = parasail_memalign_int64_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHMStore, vZero, segLen);
    parasail_memset___m128i(pvHSStore, vZero, segLen);
    parasail_memset___m128i(pvHLStore, vZero, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            __m128i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vH_dag;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        const __m128i* vP = NULL;
        const __m128i* vPM = NULL;
        const __m128i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop. */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 8 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vHM = _mm_load_si128(&pvHMStore[segLen - 1]);
        vHS = _mm_load_si128(&pvHSStore[segLen - 1]);
        vHL = _mm_load_si128(&pvHLStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 8);
        vHM = _mm_slli_si128(vHM, 8);
        vHS = _mm_slli_si128(vHS, 8);
        vHL = _mm_slli_si128(vHL, 8);

        /* insert upper boundary condition */
        vH = _mm_insert_epi64_rpl(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m128i case1;
            __m128i case2;

            vE = _mm_load_si128(pvE+ i);
            vEM = _mm_load_si128(pvEM+ i);
            vES = _mm_load_si128(pvES+ i);
            vEL = _mm_load_si128(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_add_epi64(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi64_rpl(vH_dag, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            case1 = _mm_cmpeq_epi64(vH, vH_dag);
            case2 = _mm_cmpeq_epi64(vH, vF);

            /* calculate vM */
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi64(vHM, _mm_load_si128(vPM + i)),
                    case1);
            _mm_store_si128(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi64(vHS, _mm_load_si128(vPS + i)),
                    case1);
            _mm_store_si128(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi64(vHL, vOne),
                    case1);
            _mm_store_si128(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm_sub_epi64(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_sub_epi64(vE, vGapE);
            vE = _mm_max_epi64_rpl(vEF_opn, vE_ext);
            case1 = _mm_cmpgt_epi64_rpl(vEF_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(
                    _mm_add_epi64(vEL, vOne),
                    _mm_add_epi64(vHL, vOne),
                    case1);
            _mm_store_si128(pvE + i, vE);
            _mm_store_si128(pvEM + i, vEM);
            _mm_store_si128(pvES + i, vES);
            _mm_store_si128(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vEF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vEF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi64(vFL, vOne),
                    _mm_add_epi64(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
            vHM = _mm_load_si128(pvHMLoad + i);
            vHS = _mm_load_si128(pvHSLoad + i);
            vHL = _mm_load_si128(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vHp = _mm_slli_si128(vHp, 8);
            vF = _mm_slli_si128(vF, 8);
            vFM = _mm_slli_si128(vFM, 8);
            vFS = _mm_slli_si128(vFS, 8);
            vFL = _mm_slli_si128(vFL, 8);
            vHp = _mm_insert_epi64_rpl(vHp, boundary[j], 0);
            vF = _mm_insert_epi64_rpl(vF, tmp2, 0);
            vFL = _mm_insert_epi64_rpl(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m128i case1;
                __m128i case2;
                __m128i cond;

                vHp = _mm_add_epi64(vHp, _mm_load_si128(vP + i));
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi64_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                case1 = _mm_cmpeq_epi64(vH, vHp);
                case2 = _mm_cmpeq_epi64(vH, vF);
                cond = _mm_andnot_si128(case1, case2);

                /* calculate vM */
                vHM = _mm_load_si128(pvHMStore + i);
                vHM = _mm_blendv_epi8(vHM, vFM, cond);
                _mm_store_si128(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm_load_si128(pvHSStore + i);
                vHS = _mm_blendv_epi8(vHS, vFS, cond);
                _mm_store_si128(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm_load_si128(pvHLStore + i);
                vHL = _mm_blendv_epi8(vHL, vFL, cond);
                _mm_store_si128(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm_sub_epi64(vH, vGapO);
                vF_ext = _mm_sub_epi64(vF, vGapE);
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi64_rpl(vF_ext, vEF_opn),
                                _mm_cmpeq_epi64(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi64_rpl(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm_cmpgt_epi64_rpl(vEF_opn, vF_ext);
                vFM = _mm_blendv_epi8(vFM, vHM, cond);
                vFS = _mm_blendv_epi8(vFS, vHS, cond);
                vFL = _mm_blendv_epi8(
                        _mm_add_epi64(vFL, vOne),
                        _mm_add_epi64(vHL, vOne),
                        cond);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

        /* extract vector containing last value from the column */
        {
            __m128i cond_max;
            vH = _mm_load_si128(pvHStore + offset);
            vHM = _mm_load_si128(pvHMStore + offset);
            vHS = _mm_load_si128(pvHSStore + offset);
            vHL = _mm_load_si128(pvHLStore + offset);
            cond_max = _mm_cmpgt_epi64_rpl(vH, vMaxH);
            vMaxH = _mm_blendv_epi8(vMaxH, vH, cond_max);
            vMaxHM = _mm_blendv_epi8(vMaxHM, vHM, cond_max);
            vMaxHS = _mm_blendv_epi8(vMaxHS, vHS, cond_max);
            vMaxHL = _mm_blendv_epi8(vMaxHL, vHL, cond_max);
            if (_mm_movemask_epi8(_mm_and_si128(vPosMask, cond_max))) {
                end_ref = j;
            }
        }
#ifdef PARASAIL_ROWCOL
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 8);
            vHM = _mm_slli_si128(vHM, 8);
            vHS = _mm_slli_si128(vHS, 8);
            vHL = _mm_slli_si128(vHL, 8);
        }
        result->stats->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
        result->stats->rowcols->matches_row[j] = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
        result->stats->rowcols->similar_row[j] = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
        result->stats->rowcols->length_row[j] = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        __m128i vHM = _mm_load_si128(pvHMStore+i);
        __m128i vHS = _mm_load_si128(pvHSStore+i);
        __m128i vHL = _mm_load_si128(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the column maximums */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 8);
            vMaxHM = _mm_slli_si128(vMaxHM, 8);
            vMaxHS = _mm_slli_si128(vMaxHS, 8);
            vMaxHL = _mm_slli_si128(vMaxHL, 8);
        }
        end_query = s1Len-1;
        score = (int64_t) _mm_extract_epi64_rpl(vMaxH, 1);
        matches = (int64_t) _mm_extract_epi64_rpl(vMaxHM, 1);
        similar = (int64_t) _mm_extract_epi64_rpl(vMaxHS, 1);
        length = (int64_t) _mm_extract_epi64_rpl(vMaxHL, 1);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvHStore;
        int64_t *m = (int64_t*)pvHMStore;
        int64_t *s = (int64_t*)pvHSStore;
        int64_t *l = (int64_t*)pvHLStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        __m128i vHM = _mm_load_si128(pvHMStore + offset);
        __m128i vHS = _mm_load_si128(pvHSStore + offset);
        __m128i vHL = _mm_load_si128(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 8);
            vHM = _mm_slli_si128(vHM, 8);
            vHS = _mm_slli_si128(vHS, 8);
            vHL = _mm_slli_si128(vHL, 8);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
        matches = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
        similar = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
        length = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}